

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

bool __thiscall
mpt::content<mpt::message_store::entry>::set_length
          (content<mpt::message_store::entry> *this,long len)

{
  ulong uVar1;
  bool bVar2;
  void *pvVar3;
  size_t len_00;
  
  uVar1 = (this->super_buffer)._used;
  bVar2 = true;
  len_00 = uVar1 + len * -8;
  if (len_00 != 0) {
    if ((ulong)(len * 8) <= uVar1 && len_00 != 0) {
      bVar2 = buffer::trim(&this->super_buffer,len_00);
      return bVar2;
    }
    pvVar3 = buffer::insert(&this->super_buffer,len * 8,0);
    bVar2 = pvVar3 != (void *)0x0;
  }
  return bVar2;
}

Assistant:

bool set_length(long len)
	{
		size_t set = len * sizeof(T);
		if (set == _used) {
			return true;
		}
		if (set < _used) {
			return buffer::trim(_used - set);
		}
		/* data before offset gets initialized */
		uint8_t *ptr = static_cast<uint8_t *>(buffer::insert(set, 0));
		return ptr ? true : false;
	}